

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_do_by_id(Curl_easy *data,curl_off_t conn_id,Curl_cpool_conn_do_cb *cb,void *cbdata)

{
  curl_off_t local_48;
  cpool_do_conn_ctx dctx;
  cpool *cpool;
  void *cbdata_local;
  Curl_cpool_conn_do_cb *cb_local;
  curl_off_t conn_id_local;
  Curl_easy *data_local;
  
  dctx.cbdata = cpool_get_instance(data);
  if ((cpool *)dctx.cbdata != (cpool *)0x0) {
    local_48 = conn_id;
    dctx.id = (curl_off_t)cb;
    dctx.cb = (Curl_cpool_conn_do_cb *)cbdata;
    if ((cpool *)dctx.cbdata != (cpool *)0x0) {
      if ((((cpool *)dctx.cbdata)->share != (Curl_share *)0x0) &&
         ((((cpool *)dctx.cbdata)->share->specifier & 0x20) != 0)) {
        Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      *(byte *)((long)dctx.cbdata + 0x68) = *(byte *)((long)dctx.cbdata + 0x68) & 0xfe | 1;
    }
    cpool_foreach(data,(cpool *)dctx.cbdata,&local_48,cpool_do_conn);
    if (((dctx.cbdata != (void *)0x0) &&
        (*(byte *)((long)dctx.cbdata + 0x68) = *(byte *)((long)dctx.cbdata + 0x68) & 0xfe,
        *(long *)((long)dctx.cbdata + 0x60) != 0)) &&
       ((*(uint *)(*(long *)((long)dctx.cbdata + 0x60) + 4) & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_do_by_id(struct Curl_easy *data, curl_off_t conn_id,
                         Curl_cpool_conn_do_cb *cb, void *cbdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_do_conn_ctx dctx;

  if(!cpool)
    return;
  dctx.id = conn_id;
  dctx.cb = cb;
  dctx.cbdata = cbdata;
  CPOOL_LOCK(cpool, data);
  cpool_foreach(data, cpool, &dctx, cpool_do_conn);
  CPOOL_UNLOCK(cpool, data);
}